

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O3

void __thiscall fasttext::Dictionary::initNgrams(Dictionary *this)

{
  vector<int,_std::allocator<int>_> *this_00;
  pointer piVar1;
  size_t __n;
  int iVar2;
  long *plVar3;
  size_type *psVar4;
  iterator __position;
  long lVar5;
  pointer peVar6;
  ulong uVar7;
  string word;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (this->size_ != 0) {
    lVar5 = 0x30;
    uVar7 = 0;
    do {
      std::operator+(&local_50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &BOW_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)(this->words_).
                            super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
                            _M_impl.super__Vector_impl_data._M_start + lVar5 + -0x30));
      plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_50,EOW_abi_cxx11_);
      psVar4 = (size_type *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar4) {
        local_70.field_2._M_allocated_capacity = *psVar4;
        local_70.field_2._8_8_ = plVar3[3];
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      }
      else {
        local_70.field_2._M_allocated_capacity = *psVar4;
        local_70._M_dataplus._M_p = (pointer)*plVar3;
      }
      local_70._M_string_length = plVar3[1];
      *plVar3 = (long)psVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_50._M_dataplus._M_p._4_4_,(int)local_50._M_dataplus._M_p) !=
          &local_50.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_50._M_dataplus._M_p._4_4_,(int)local_50._M_dataplus._M_p));
      }
      peVar6 = (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
               _M_impl.super__Vector_impl_data._M_start;
      this_00 = (vector<int,_std::allocator<int>_> *)
                ((long)&(peVar6->word)._M_dataplus._M_p + lVar5);
      piVar1 = *(pointer *)((long)&(peVar6->word)._M_dataplus._M_p + lVar5);
      __position._M_current = *(int **)((long)&(peVar6->word)._M_string_length + lVar5);
      if (__position._M_current != piVar1) {
        (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish = piVar1;
        __position._M_current = piVar1;
      }
      local_50._M_dataplus._M_p._0_4_ = (int)uVar7;
      if (__position._M_current == *(int **)((long)&(peVar6->word).field_2 + lVar5)) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (this_00,__position,(int *)&local_50);
        peVar6 = (this->words_).
                 super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>._M_impl.
                 super__Vector_impl_data._M_start;
      }
      else {
        *__position._M_current = (int)local_50._M_dataplus._M_p;
        (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish = __position._M_current + 1;
      }
      __n = *(size_t *)((long)peVar6 + lVar5 + -0x28);
      if (__n == DAT_0014c278) {
        if (__n != 0) {
          iVar2 = bcmp(*(void **)((long)peVar6 + lVar5 + -0x30),EOS_abi_cxx11_,__n);
          if (iVar2 != 0) goto LAB_00126a45;
        }
      }
      else {
LAB_00126a45:
        computeSubwords(this,&local_70,
                        (vector<int,_std::allocator<int>_> *)
                        ((long)&(peVar6->word)._M_dataplus._M_p + lVar5),
                        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)0x0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      uVar7 = uVar7 + 1;
      lVar5 = lVar5 + 0x48;
    } while (uVar7 < (ulong)(long)this->size_);
  }
  return;
}

Assistant:

void Dictionary::initNgrams() {
  for (size_t i = 0; i < size_; i++) {
    std::string word = BOW + words_[i].word + EOW;
    words_[i].subwords.clear();
    words_[i].subwords.push_back(i);
    if (words_[i].word != EOS) {
      computeSubwords(word, words_[i].subwords);
    }
  }
}